

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

int __thiscall
booster::
sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::compare(sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,value_type *s)

{
  int iVar1;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  string local_30 [48];
  
  str(in_stack_00000008);
  iVar1 = std::__cxx11::string::compare((char *)local_30);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int compare(value_type const *s) const
		{
			return str().compare(s);
		}